

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O2

void freeattr(attr *a)

{
  int iVar1;
  field_t *pfVar2;
  arg_t *paVar3;
  field_t *__ptr;
  arg_t *__ptr_00;
  
  iVar1 = a->kind;
  if (iVar1 == 1) {
    freeattr(((a->field_1).array)->type);
  }
  else {
    if (iVar1 != 2) {
      if (iVar1 == 3) {
        freeattr(((a->field_1).function)->return_type);
        __ptr_00 = ((a->field_1).function)->arg_list;
        while (__ptr_00 != (arg_t *)0x0) {
          freeattr(__ptr_00->arg);
          paVar3 = __ptr_00->next;
          free(__ptr_00);
          __ptr_00 = paVar3;
        }
        free((a->field_1).basic);
      }
      abort();
    }
    __ptr = ((a->field_1).structure)->field;
    while (__ptr != (field_t *)0x0) {
      freeattr(__ptr->type);
      pfVar2 = __ptr->next;
      free(__ptr);
      __ptr = pfVar2;
    }
  }
  free((a->field_1).basic);
  return;
}

Assistant:

void freeattr(struct attr *a) {
    switch (a->kind) {
        case ARRAY:
            freeattr(a->array->type);
            free(a->array);
            break;
        case STRUCTURE:
            freefield(a->structure->field);
            free(a->structure);
            break;
        case FUNCTION:
            freeattr(a->function->return_type);
            freearg(a->function->arg_list);
            free(a->function);
        default:
            abort();
    }
}